

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O2

spv_result_t
spvtools::val::anon_unknown_0::checkLayout
          (uint32_t struct_id,char *storage_class_str,char *decoration_str,bool blockRules,
          bool scalar_block_layout,uint32_t incoming_offset,MemberConstraints *constraints,
          ValidationState_t *vstate)

{
  ushort uVar1;
  uint16_t uVar2;
  spv_const_validator_options psVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  spv_result_t sVar7;
  uint uVar8;
  _Rb_tree_color _Var9;
  Instruction *pIVar10;
  pointer pMVar11;
  const_iterator cVar12;
  void *pvVar13;
  mapped_type *pmVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Instruction *pIVar15;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *psVar16;
  _Base_ptr p_Var17;
  DiagnosticStream *pDVar18;
  bool roundUp;
  size_t __n;
  _Bit_pointer extraout_RDX;
  _Bit_pointer extraout_RDX_00;
  _Bit_pointer puVar19;
  _Bit_pointer extraout_RDX_01;
  _Bit_pointer __n_00;
  _Bit_pointer extraout_RDX_02;
  _Rb_tree_color _Var20;
  uint uVar21;
  ulong uVar22;
  _Rb_tree_color _Var23;
  pointer pMVar24;
  vector<bool,_std::allocator<bool>_> *__x;
  char *pcVar25;
  byte bVar26;
  int iVar27;
  _Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_> *this;
  ulong uVar28;
  uint uVar29;
  bool bVar30;
  bool bVar31;
  FieldDecorationsIter FVar32;
  reference rVar33;
  spv_result_t local_2f0;
  bool local_2e1;
  pointer local_2e0;
  ulong local_2d8;
  ulong local_2d0;
  ulong local_2c8;
  uint local_2bc;
  uint32_t struct_id_local;
  allocator_type local_2b1;
  mapped_type *local_2b0;
  _Bit_type *local_2a8;
  uint local_2a0;
  uint local_29c;
  pointer local_298;
  char *local_290;
  char *local_288;
  anon_class_40_7_b84d8406 fail;
  vector<MemberOffsetPair,_std::allocator<MemberOffsetPair>_> member_offsets;
  vector<unsigned_int,_std::allocator<unsigned_int>_> members;
  vector<bool,_std::allocator<bool>_> seen;
  spv_result_t local_38;
  
  local_2c8 = CONCAT44(local_2c8._4_4_,incoming_offset);
  psVar3 = vstate->options_;
  sVar7 = SPV_SUCCESS;
  if (psVar3->skip_block_layout == false) {
    roundUp = (bool)(~psVar3->uniform_buffer_standard_layout & blockRules);
    bVar26 = 1;
    if ((vstate->features_).env_relaxed_block_layout == false) {
      bVar26 = psVar3->relax_block_layout;
    }
    fail.vstate = vstate;
    struct_id_local = struct_id;
    local_290 = storage_class_str;
    local_288 = decoration_str;
    fail.struct_id = struct_id;
    fail.storage_class_str = storage_class_str;
    fail.decoration_str = decoration_str;
    fail.blockRules = roundUp;
    fail.relaxed_block_layout = (bool)bVar26;
    fail.scalar_block_layout = scalar_block_layout;
    pIVar10 = ValidationState_t::FindDef(vstate,struct_id);
    members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if ((pIVar10->inst_).opcode == 0x1e) {
      getStructMembers((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&seen,struct_id,vstate
                      );
      __x = &seen;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(&members);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&seen);
    }
    else {
      __x = (vector<bool,_std::allocator<bool>_> *)&struct_id_local;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&members,(value_type_conflict2 *)__x);
    }
    member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar29 = (uint)scalar_block_layout;
    if ((pIVar10->inst_).opcode == 0x1e) {
      this = (_Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_> *)
             ((long)members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2);
      if ((ulong)this >> 0x3c != 0) {
        std::__throw_length_error("vector::reserve");
      }
      _Var23 = _S_red;
      _Var9 = _S_red;
      if (members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        pMVar11 = std::_Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>::
                  _M_allocate(this,(size_t)__x);
        std::_Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>::_M_deallocate
                  ((_Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_> *)0x0,
                   (pointer)0x0,__n);
        member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = pMVar11 + (long)this;
        _Var9 = (_Rb_tree_color)
                ((ulong)((long)members.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)members.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
        member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
        _M_impl.super__Vector_impl_data._M_finish = pMVar11;
      }
      member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>._M_impl
      .super__Vector_impl_data._M_start =
           member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      for (; pMVar24 = member_offsets.
                       super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
                       _M_impl.super__Vector_impl_data._M_start, _Var23 != _Var9;
          _Var23 = _Var23 + _S_black) {
        FVar32 = ValidationState_t::id_member_decorations(vstate,struct_id_local,_Var23);
        _Var20 = ~_S_red;
        for (cVar12 = FVar32.begin._M_node; cVar12._M_node != FVar32.end._M_node._M_node;
            cVar12._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar12._M_node)) {
          if (cVar12._M_node[2]._M_color != _Var23) {
            __assert_fail("decoration->struct_member_index() == (int)memberIdx",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                          ,0x1d4,
                          "spv_result_t spvtools::val::(anonymous namespace)::checkLayout(uint32_t, const char *, const char *, bool, bool, uint32_t, MemberConstraints &, ValidationState_t &)"
                         );
          }
          if (cVar12._M_node[1]._M_color == 0x23) {
            _Var20 = (cVar12._M_node[1]._M_parent)->_M_color;
          }
        }
        seen.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
        super__Bit_iterator_base._M_p = (_Bit_type *)CONCAT44(_Var20 + (int)local_2c8,_Var23);
        std::vector<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>::push_back
                  (&member_offsets,(value_type *)&seen);
      }
      pMVar11 = member_offsets.
                super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        local_298 = member_offsets.
                    super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        uVar22 = (((long)member_offsets.
                         super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)member_offsets.
                         super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3) + 1) / 2;
        while (pMVar11 = local_298, 0 < (long)uVar22) {
          uVar28 = uVar22 * 8;
          pvVar13 = operator_new(uVar28,(nothrow_t *)&std::nothrow);
          pMVar11 = local_298;
          if (pvVar13 != (void *)0x0) {
            std::
            __stable_sort_adaptive<__gnu_cxx::__normal_iterator<spvtools::val::(anonymous_namespace)::checkLayout(unsigned_int,char_const*,char_const*,bool,bool,unsigned_int,std::unordered_map<std::pair<unsigned_int,unsigned_int>,spvtools::val::(anonymous_namespace)::LayoutConstraints,spvtools::val::(anonymous_namespace)::PairHash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,spvtools::val::(anonymous_namespace)::LayoutConstraints>>>&,spvtools::val::ValidationState_t&)::MemberOffsetPair*,std::vector<spvtools::val::(anonymous_namespace)::checkLayout(unsigned_int,char_const*,char_const*,bool,bool,unsigned_int,std::unordered_map<std::pair<unsigned_int,unsigned_int>,spvtools::val::(anonymous_namespace)::LayoutConstraints,spvtools::val::(anonymous_namespace)::PairHash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,spvtools::val::(anonymous_namespace)::LayoutCo___pvtools::val::(anonymous_namespace)::LayoutConstraints>>>&,spvtools::val::ValidationState_t&)::__0>>
                      (pMVar24,local_298,pvVar13,uVar22);
            goto LAB_001b50f6;
          }
          bVar31 = uVar22 == 1;
          uVar22 = uVar22 + 1 >> 1;
          if (bVar31) {
            uVar22 = 0;
          }
        }
        std::
        __inplace_stable_sort<__gnu_cxx::__normal_iterator<spvtools::val::(anonymous_namespace)::checkLayout(unsigned_int,char_const*,char_const*,bool,bool,unsigned_int,std::unordered_map<std::pair<unsigned_int,unsigned_int>,spvtools::val::(anonymous_namespace)::LayoutConstraints,spvtools::val::(anonymous_namespace)::PairHash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,spvtools::val::(anonymous_namespace)::LayoutConstraints>>>&,spvtools::val::ValidationState_t&)::MemberOffsetPair*,std::vector<spvtools::val::(anonymous_namespace)::checkLayout(unsigned_int,char_const*,char_const*,bool,bool,unsigned_int,std::unordered_map<std::pair<unsigned_int,unsigned_int>,spvtools::val::(anonymous_namespace)::LayoutConstraints,spvtools::val::(anonymous_namespace)::PairHash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,spvtools::val::(anonymous_namespace)::LayoutCon___pvtools::val::(anonymous_namespace)::LayoutConstraints>>>&,spvtools::val::ValidationState_t&)::__0>>
                  (pMVar24,local_298);
        uVar28 = 0;
        pvVar13 = (void *)0x0;
LAB_001b50f6:
        operator_delete(pvVar13,uVar28);
      }
    }
    else {
      seen.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      std::vector<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>::push_back
                (&member_offsets,(value_type *)&seen);
      pMVar11 = member_offsets.
                super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pMVar24 = member_offsets.
                super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    local_298 = (pointer)((long)pMVar11 - (long)pMVar24 >> 3);
    local_2a8 = (_Bit_type *)0x0;
    local_2e0 = pMVar24;
    for (puVar19 = (_Bit_pointer)0x0; (pointer)puVar19 != local_298;
        puVar19 = (_Bit_pointer)((long)puVar19 + 1)) {
      local_2d8 = (ulong)local_2e0[(long)puVar19].member;
      local_2c8 = (ulong)local_2e0[(long)puVar19].offset;
      uVar6 = members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[local_2d8];
      seen.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p =
           (_Bit_type *)CONCAT44(local_2e0[(long)puVar19].member,struct_id_local);
      pmVar14 = std::
                unordered_map<std::pair<unsigned_int,_unsigned_int>,_spvtools::val::(anonymous_namespace)::LayoutConstraints,_spvtools::val::(anonymous_namespace)::PairHash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_spvtools::val::(anonymous_namespace)::LayoutConstraints>_>_>
                ::operator[](constraints,(key_type *)&seen);
      local_2bc = (uint)roundUp;
      if (scalar_block_layout) {
        uVar4 = getScalarAlignment(uVar6,vstate);
        local_2d0 = CONCAT44(extraout_var,uVar4);
      }
      else {
        uVar4 = getBaseAlignment(uVar6,roundUp,pmVar14,constraints,vstate);
        local_2d0 = CONCAT44(extraout_var_00,uVar4);
      }
      pIVar10 = ValidationState_t::FindDef(vstate,uVar6);
      uVar1 = (pIVar10->inst_).opcode;
      local_2b0 = pmVar14;
      uVar4 = getSize(uVar6,pmVar14,constraints,vstate);
      uVar8 = (uint)local_2c8;
      uVar5 = (uint32_t)local_2d8;
      if (uVar8 == 0xffffffff) {
        checkLayout::anon_class_40_7_b84d8406::operator()((DiagnosticStream *)&seen,&fail,uVar5);
        pcVar25 = "is missing an Offset decoration";
LAB_001b56b0:
        std::operator<<((ostream *)&seen,pcVar25);
LAB_001b56b8:
        local_2f0 = local_38;
LAB_001b56c5:
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&seen);
        __n_00 = extraout_RDX_01;
        pMVar11 = local_2e0;
        sVar7 = local_2f0;
        goto LAB_001b56cf;
      }
      local_2a0 = (uint)uVar1;
      local_29c = uVar29;
      if ((local_2a0 == 0x17 & bVar26 & !scalar_block_layout) == 1) {
        uVar5 = getScalarAlignment((pIVar10->words_).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[2],vstate);
        uVar8 = (uint)local_2c8;
        if (uVar5 != 0) {
          uVar8 = (uint)((local_2c8 & 0xffffffff) % (ulong)uVar5);
        }
        if (uVar8 == 0) {
          if ((uint)local_2c8 < (uint)local_2a8) goto LAB_001b5739;
          uVar6 = getSize(uVar6,local_2b0,constraints,vstate);
          if (uVar6 < 0x11) {
            if (0xf < ((uVar6 + (uint)local_2c8) - 1 ^ (uint)local_2c8)) {
LAB_001b5893:
              checkLayout::anon_class_40_7_b84d8406::operator()
                        ((DiagnosticStream *)&seen,&fail,(uint32_t)local_2d8);
              std::operator<<((ostream *)&seen,"is an improperly straddling vector at offset ");
              goto LAB_001b58c5;
            }
          }
          else if ((local_2c8 & 0xf) != 0) goto LAB_001b5893;
          goto LAB_001b5341;
        }
        checkLayout::anon_class_40_7_b84d8406::operator()
                  ((DiagnosticStream *)&seen,&fail,(uint32_t)local_2d8);
        std::operator<<((ostream *)&seen,"at offset ");
        std::ostream::_M_insert<unsigned_long>((ulong)&seen);
        std::operator<<((ostream *)&seen," is not aligned to scalar element size ");
LAB_001b58c5:
        std::ostream::_M_insert<unsigned_long>((ulong)&seen);
        goto LAB_001b56b8;
      }
      uVar21 = uVar8;
      if ((int)local_2d0 != 0) {
        uVar21 = (uint)((local_2c8 & 0xffffffff) % (local_2d0 & 0xffffffff));
      }
      if (uVar21 != 0) {
        checkLayout::anon_class_40_7_b84d8406::operator()((DiagnosticStream *)&seen,&fail,uVar5);
        std::operator<<((ostream *)&seen,"at offset ");
        std::ostream::_M_insert<unsigned_long>((ulong)&seen);
        std::operator<<((ostream *)&seen," is not aligned to ");
        goto LAB_001b58c5;
      }
      if (uVar8 < (uint)local_2a8) {
LAB_001b5739:
        checkLayout::anon_class_40_7_b84d8406::operator()
                  ((DiagnosticStream *)&seen,&fail,(uint32_t)local_2d8);
        std::operator<<((ostream *)&seen,"at offset ");
        std::ostream::_M_insert<unsigned_long>((ulong)&seen);
        std::operator<<((ostream *)&seen," overlaps previous member ending at offset ");
LAB_001b5787:
        std::ostream::_M_insert<unsigned_long>((ulong)&seen);
        local_2f0 = local_38;
        goto LAB_001b56c5;
      }
      if (local_2a0 == 0x18) {
        uVar8 = local_2b0->matrix_stride;
        if ((int)local_2d0 != 0) {
          uVar8 = (uint)((ulong)uVar8 % (local_2d0 & 0xffffffff));
        }
        if (uVar8 != 0) {
          checkLayout::anon_class_40_7_b84d8406::operator()((DiagnosticStream *)&seen,&fail,uVar5);
          std::operator<<((ostream *)&seen,"is a matrix with stride ");
          std::ostream::_M_insert<unsigned_long>((ulong)&seen);
          std::operator<<((ostream *)&seen," not satisfying alignment to ");
          goto LAB_001b5787;
        }
      }
      else if ((local_2a0 == 0x1e) &&
              (sVar7 = checkLayout(uVar6,local_290,local_288,SUB41(local_2bc,0),scalar_block_layout,
                                   uVar8,constraints,vstate), __n_00 = extraout_RDX,
              pMVar11 = local_2e0, sVar7 != SPV_SUCCESS)) goto LAB_001b56cf;
LAB_001b5341:
      uVar22 = local_2d0 & 0xffffffff;
      while (((pIVar10->inst_).opcode & 0xfffe) == 0x1c) {
        uVar6 = (pIVar10->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[2];
        local_2a8 = (_Bit_type *)CONCAT44(local_2a8._4_4_,uVar6);
        pIVar15 = ValidationState_t::FindDef(vstate,uVar6);
        psVar16 = ValidationState_t::id_decorations(vstate,(pIVar10->inst_).result_id);
        _Var23 = _S_red;
        for (p_Var17 = (psVar16->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var17 != &(psVar16->_M_t)._M_impl.super__Rb_tree_header;
            p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17)) {
          if (p_Var17[1]._M_color == 6) {
            _Var23 = (p_Var17[1]._M_parent)->_M_color;
            if (_Var23 == _S_red) {
              checkLayout::anon_class_40_7_b84d8406::operator()
                        ((DiagnosticStream *)&seen,&fail,(uint32_t)local_2d8);
              pcVar25 = "contains an array with stride 0";
              goto LAB_001b56b0;
            }
            if (((int)uVar22 == 0) || ((int)((ulong)_Var23 % uVar22) != 0)) {
              checkLayout::anon_class_40_7_b84d8406::operator()
                        ((DiagnosticStream *)&seen,&fail,(uint32_t)local_2d8);
              std::operator<<((ostream *)&seen,"contains an array with stride ");
              pDVar18 = DiagnosticStream::operator<<
                                  ((DiagnosticStream *)&seen,&(p_Var17[1]._M_parent)->_M_color);
              std::operator<<((ostream *)pDVar18," not satisfying alignment to ");
              std::ostream::_M_insert<unsigned_long>((ulong)pDVar18);
              local_2f0 = pDVar18->error_;
              goto LAB_001b56c5;
            }
          }
        }
        iVar27 = 1;
        if ((pIVar10->inst_).opcode == 0x1c) {
          ValidationState_t::EvalInt32IfConst
                    ((tuple<bool,_bool,_unsigned_int> *)&seen,vstate,
                     (pIVar10->words_).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[3]);
          iVar27 = (int)seen.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                   (uint)((int)seen.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p == 0)
          ;
        }
        pMVar11 = local_2e0;
        uVar2 = (pIVar15->inst_).opcode;
        if (uVar2 == 0x18) {
          uVar8 = local_2b0->matrix_stride;
          if ((int)local_2d0 != 0) {
            uVar8 = (uint)((ulong)uVar8 % (local_2d0 & 0xffffffff));
          }
          if (uVar8 != 0) {
            checkLayout::anon_class_40_7_b84d8406::operator()
                      ((DiagnosticStream *)&seen,&fail,(uint32_t)local_2d8);
            std::operator<<((ostream *)&seen,"is a matrix with stride ");
            std::ostream::_M_insert<unsigned_long>((ulong)&seen);
            std::operator<<((ostream *)&seen," not satisfying alignment to ");
            std::ostream::_M_insert<unsigned_long>((ulong)&seen);
            local_2f0 = local_38;
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&seen);
            __n_00 = extraout_RDX_02;
            sVar7 = local_2f0;
            goto LAB_001b56cf;
          }
        }
        else if (uVar2 == 0x1e) {
          local_2e1 = false;
          std::vector<bool,_std::allocator<bool>_>::vector(&seen,0x10,&local_2e1,&local_2b1);
          uVar8 = local_2bc;
          uVar22 = local_2c8 & 0xffffffff;
          while( true ) {
            bVar31 = true;
            bVar30 = iVar27 == 0;
            iVar27 = iVar27 + -1;
            if (bVar30) break;
            uVar21 = (uint)uVar22;
            rVar33 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (&seen,(ulong)(uVar21 & 0xf));
            if ((*rVar33._M_p & rVar33._M_mask) != 0) break;
            sVar7 = checkLayout((uint32_t)local_2a8,local_290,local_288,SUB41(uVar8,0),
                                SUB41(local_29c,0),uVar21,constraints,vstate);
            if (sVar7 != SPV_SUCCESS) {
              bVar31 = false;
              local_2f0 = sVar7;
              break;
            }
            rVar33 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (&seen,(ulong)(uVar21 & 0xf));
            *rVar33._M_p = *rVar33._M_p | rVar33._M_mask;
            uVar22 = (ulong)(uVar21 + _Var23);
          }
          std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
                    (&seen.super__Bvector_base<std::allocator<bool>_>);
          __n_00 = extraout_RDX_00;
          pMVar11 = local_2e0;
          sVar7 = local_2f0;
          if (!bVar31) goto LAB_001b56cf;
        }
        pmVar14 = local_2b0;
        uVar6 = (pIVar15->inst_).result_id;
        if (scalar_block_layout) {
          uVar8 = getScalarAlignment(uVar6,vstate);
          pmVar14 = local_2b0;
        }
        else {
          uVar8 = getBaseAlignment(uVar6,SUB41(local_2bc,0),local_2b0,constraints,vstate);
        }
        uVar22 = (ulong)uVar8;
        _Var9 = getSize((pIVar15->inst_).result_id,pmVar14,constraints,vstate);
        pIVar10 = pIVar15;
        if (_Var23 < _Var9) {
          checkLayout::anon_class_40_7_b84d8406::operator()
                    ((DiagnosticStream *)&seen,&fail,(uint32_t)local_2d8);
          std::operator<<((ostream *)&seen,"contains an array with stride ");
          std::ostream::_M_insert<unsigned_long>((ulong)&seen);
          std::operator<<((ostream *)&seen,", but with an element size of ");
          std::ostream::_M_insert<unsigned_long>((ulong)&seen);
          local_2f0 = local_38;
          goto LAB_001b56c5;
        }
      }
      uVar8 = uVar4 + (int)local_2c8;
      local_2a8 = (_Bit_type *)(ulong)uVar8;
      if ((!scalar_block_layout) && ((local_2a0 | 2) == 0x1e)) {
        local_2a8 = (_Bit_type *)(ulong)(-(int)local_2d0 & (uVar8 + (int)local_2d0) - 1);
      }
    }
    local_2f0 = SPV_SUCCESS;
    __n_00 = puVar19;
    pMVar11 = local_2e0;
    sVar7 = local_2f0;
LAB_001b56cf:
    local_2f0 = sVar7;
    std::_Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>::_M_deallocate
              ((_Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_> *)pMVar11,
               (pointer)((long)member_offsets.
                               super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pMVar11 >>
                        3),(size_t)__n_00);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    sVar7 = local_2f0;
  }
  return sVar7;
}

Assistant:

spv_result_t checkLayout(uint32_t struct_id, const char* storage_class_str,
                         const char* decoration_str, bool blockRules,
                         bool scalar_block_layout,
                         uint32_t incoming_offset,
                         MemberConstraints& constraints,
                         ValidationState_t& vstate) {
  if (vstate.options()->skip_block_layout) return SPV_SUCCESS;

  // blockRules are the same as bufferBlock rules if the uniform buffer
  // standard layout extension is being used.
  if (vstate.options()->uniform_buffer_standard_layout) blockRules = false;

  // Relaxed layout and scalar layout can both be in effect at the same time.
  // For example, relaxed layout is implied by Vulkan 1.1.  But scalar layout
  // is more permissive than relaxed layout.
  const bool relaxed_block_layout = vstate.IsRelaxedBlockLayout();

  auto fail = [&vstate, struct_id, storage_class_str, decoration_str,
               blockRules, relaxed_block_layout,
               scalar_block_layout](uint32_t member_idx) -> DiagnosticStream {
    DiagnosticStream ds =
        std::move(vstate.diag(SPV_ERROR_INVALID_ID, vstate.FindDef(struct_id))
                  << "Structure id " << struct_id << " decorated as "
                  << decoration_str << " for variable in " << storage_class_str
                  << " storage class must follow "
                  << (scalar_block_layout
                          ? "scalar "
                          : (relaxed_block_layout ? "relaxed " : "standard "))
                  << (blockRules ? "uniform buffer" : "storage buffer")
                  << " layout rules: member " << member_idx << " ");
    return ds;
  };

  // If we are checking the layout of untyped pointers or physical storage
  // buffer pointers, we may not actually have a struct here. Instead, pretend
  // we have a struct with a single member at offset 0.
  const auto& struct_type = vstate.FindDef(struct_id);
  std::vector<uint32_t> members;
  if (struct_type->opcode() == spv::Op::OpTypeStruct) {
    members = getStructMembers(struct_id, vstate);
  } else {
    members.push_back(struct_id);
  }

  // To check for member overlaps, we want to traverse the members in
  // offset order.
  struct MemberOffsetPair {
    uint32_t member;
    uint32_t offset;
  };
  std::vector<MemberOffsetPair> member_offsets;

  // With untyped pointers or physical storage buffers, we might be checking
  // layouts that do not originate from a structure.
  if (struct_type->opcode() == spv::Op::OpTypeStruct) {
    member_offsets.reserve(members.size());
    for (uint32_t memberIdx = 0, numMembers = uint32_t(members.size());
         memberIdx < numMembers; memberIdx++) {
      uint32_t offset = 0xffffffff;
      auto member_decorations =
          vstate.id_member_decorations(struct_id, memberIdx);
      for (auto decoration = member_decorations.begin;
           decoration != member_decorations.end; ++decoration) {
        assert(decoration->struct_member_index() == (int)memberIdx);
        switch (decoration->dec_type()) {
          case spv::Decoration::Offset:
            offset = decoration->params()[0];
            break;
          default:
            break;
        }
      }
      member_offsets.push_back(
          MemberOffsetPair{memberIdx, incoming_offset + offset});
    }
    std::stable_sort(
        member_offsets.begin(), member_offsets.end(),
        [](const MemberOffsetPair& lhs, const MemberOffsetPair& rhs) {
          return lhs.offset < rhs.offset;
        });
  } else {
    member_offsets.push_back({0, 0});
  }

  // Now scan from lowest offset to highest offset.
  uint32_t nextValidOffset = 0;
  for (size_t ordered_member_idx = 0;
       ordered_member_idx < member_offsets.size(); ordered_member_idx++) {
    const auto& member_offset = member_offsets[ordered_member_idx];
    const auto memberIdx = member_offset.member;
    const auto offset = member_offset.offset;
    auto id = members[member_offset.member];
    const LayoutConstraints& constraint =
        constraints[std::make_pair(struct_id, uint32_t(memberIdx))];
    // Scalar layout takes precedence because it's more permissive, and implying
    // an alignment that divides evenly into the alignment that would otherwise
    // be used.
    const auto alignment =
        scalar_block_layout
            ? getScalarAlignment(id, vstate)
            : getBaseAlignment(id, blockRules, constraint, constraints, vstate);
    const auto inst = vstate.FindDef(id);
    const auto opcode = inst->opcode();
    const auto size = getSize(id, constraint, constraints, vstate);
    // Check offset.
    if (offset == 0xffffffff)
      return fail(memberIdx) << "is missing an Offset decoration";
    if (!scalar_block_layout && relaxed_block_layout &&
        opcode == spv::Op::OpTypeVector) {
      // In relaxed block layout, the vector offset must be aligned to the
      // vector's scalar element type.
      const auto componentId = inst->words()[2];
      const auto scalar_alignment = getScalarAlignment(componentId, vstate);
      if (!IsAlignedTo(offset, scalar_alignment)) {
        return fail(memberIdx)
               << "at offset " << offset
               << " is not aligned to scalar element size " << scalar_alignment;
      }
    } else {
      // Without relaxed block layout, the offset must be divisible by the
      // alignment requirement.
      if (!IsAlignedTo(offset, alignment)) {
        return fail(memberIdx)
               << "at offset " << offset << " is not aligned to " << alignment;
      }
    }
    if (offset < nextValidOffset)
      return fail(memberIdx) << "at offset " << offset
                             << " overlaps previous member ending at offset "
                             << nextValidOffset - 1;
    if (!scalar_block_layout && relaxed_block_layout) {
      // Check improper straddle of vectors.
      if (spv::Op::OpTypeVector == opcode &&
          hasImproperStraddle(id, offset, constraint, constraints, vstate))
        return fail(memberIdx)
               << "is an improperly straddling vector at offset " << offset;
    }
    // Check struct members recursively.
    spv_result_t recursive_status = SPV_SUCCESS;
    if (spv::Op::OpTypeStruct == opcode &&
        SPV_SUCCESS != (recursive_status = checkLayout(
                            id, storage_class_str, decoration_str, blockRules,
                            scalar_block_layout, offset, constraints, vstate)))
      return recursive_status;
    // Check matrix stride.
    if (spv::Op::OpTypeMatrix == opcode) {
      const auto stride = constraint.matrix_stride;
      if (!IsAlignedTo(stride, alignment)) {
        return fail(memberIdx) << "is a matrix with stride " << stride
                               << " not satisfying alignment to " << alignment;
      }
    }

    // Check arrays and runtime arrays recursively.
    auto array_inst = inst;
    auto array_alignment = alignment;
    while (array_inst->opcode() == spv::Op::OpTypeArray ||
           array_inst->opcode() == spv::Op::OpTypeRuntimeArray) {
      const auto typeId = array_inst->word(2);
      const auto element_inst = vstate.FindDef(typeId);
      // Check array stride.
      uint32_t array_stride = 0;
      for (auto& decoration : vstate.id_decorations(array_inst->id())) {
        if (spv::Decoration::ArrayStride == decoration.dec_type()) {
          array_stride = decoration.params()[0];
          if (array_stride == 0) {
            return fail(memberIdx) << "contains an array with stride 0";
          }
          if (!IsAlignedTo(array_stride, array_alignment))
            return fail(memberIdx)
                   << "contains an array with stride " << decoration.params()[0]
                   << " not satisfying alignment to " << alignment;
        }
      }

      bool is_int32 = false;
      bool is_const = false;
      uint32_t num_elements = 0;
      if (array_inst->opcode() == spv::Op::OpTypeArray) {
        std::tie(is_int32, is_const, num_elements) =
            vstate.EvalInt32IfConst(array_inst->word(3));
      }
      num_elements = std::max(1u, num_elements);
      // Check each element recursively if it is a struct. There is a
      // limitation to this check if the array size is a spec constant or is a
      // runtime array then we will only check a single element. This means
      // some improper straddles might be missed.
      if (spv::Op::OpTypeStruct == element_inst->opcode()) {
        std::vector<bool> seen(16, false);
        for (uint32_t i = 0; i < num_elements; ++i) {
          uint32_t next_offset = i * array_stride + offset;
          // Stop checking if offsets repeat in terms of 16-byte multiples.
          if (seen[next_offset % 16]) {
            break;
          }

          if (SPV_SUCCESS !=
              (recursive_status = checkLayout(
                   typeId, storage_class_str, decoration_str, blockRules,
                   scalar_block_layout, next_offset, constraints, vstate)))
            return recursive_status;

          seen[next_offset % 16] = true;
        }
      } else if (spv::Op::OpTypeMatrix == element_inst->opcode()) {
        // Matrix stride would be on the array element in the struct.
        const auto stride = constraint.matrix_stride;
        if (!IsAlignedTo(stride, alignment)) {
          return fail(memberIdx)
                 << "is a matrix with stride " << stride
                 << " not satisfying alignment to " << alignment;
        }
      }

      // Proceed to the element in case it is an array.
      array_inst = element_inst;
      array_alignment = scalar_block_layout
                            ? getScalarAlignment(array_inst->id(), vstate)
                            : getBaseAlignment(array_inst->id(), blockRules,
                                               constraint, constraints, vstate);

      const auto element_size =
          getSize(element_inst->id(), constraint, constraints, vstate);
      if (element_size > array_stride) {
        return fail(memberIdx)
               << "contains an array with stride " << array_stride
               << ", but with an element size of " << element_size;
      }
    }
    nextValidOffset = offset + size;
    if (!scalar_block_layout &&
        (spv::Op::OpTypeArray == opcode || spv::Op::OpTypeStruct == opcode)) {
      // Non-scalar block layout rules don't permit anything in the padding of
      // a struct or array.
      nextValidOffset = align(nextValidOffset, alignment);
    }
  }
  return SPV_SUCCESS;
}